

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zx7.h
# Opt level: O0

int elias_gamma_bits(int value)

{
  undefined4 local_10;
  undefined4 local_c;
  int bits;
  int value_local;
  
  local_10 = 1;
  for (local_c = value; 1 < local_c; local_c = local_c >> 1) {
    local_10 = local_10 + 2;
  }
  return local_10;
}

Assistant:

int elias_gamma_bits(int value) {
    int bits;

    bits = 1;
    while (value > 1) {
        bits += 2;
        value >>= 1;
    }
    return bits;
}